

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es2fFlushFinishTests.cpp
# Opt level: O0

int __thiscall
deqp::gles2::Functional::anon_unknown_0::FlushFinishCase::init
          (FlushFinishCase *this,EVP_PKEY_CTX *ctx)

{
  bool bVar1;
  ShaderProgram *pSVar2;
  RenderContext *renderCtx;
  ProgramSources *pPVar3;
  undefined7 extraout_var;
  TestLog *log;
  TestError *this_00;
  int local_1cc;
  string local_1c8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1a8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_188;
  ShaderSource local_168;
  allocator<char> local_139;
  string local_138;
  ShaderSource local_118;
  ProgramSources local_f0;
  FlushFinishCase *local_10;
  FlushFinishCase *this_local;
  
  local_10 = this;
  pSVar2 = (ShaderProgram *)operator_new(0xd0);
  renderCtx = gles2::Context::getRenderContext((this->super_TestCase).m_context);
  glu::ProgramSources::ProgramSources(&local_f0);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_138,
             "attribute highp vec4 a_position;\nvarying highp vec4 v_coord;\nvoid main (void)\n{\n\tgl_Position = a_position;\n\tv_coord = a_position;\n}\n"
             ,&local_139);
  glu::VertexSource::VertexSource((VertexSource *)&local_118,&local_138);
  pPVar3 = glu::ProgramSources::operator<<(&local_f0,&local_118);
  local_1cc = 10;
  de::toString<int>(&local_1c8,&local_1cc);
  std::operator+(&local_1a8,
                 "uniform mediump int u_numIters;\nvarying mediump vec4 v_coord;\nvoid main (void)\n{\n\thighp vec4 color = v_coord;\n\tfor (int i = 0; i < "
                 ,&local_1c8);
  std::operator+(&local_188,&local_1a8,
                 "; i++)\n\t\tcolor = sin(color);\n\tgl_FragColor = color;\n}\n");
  glu::FragmentSource::FragmentSource((FragmentSource *)&local_168,&local_188);
  pPVar3 = glu::ProgramSources::operator<<(pPVar3,&local_168);
  glu::ShaderProgram::ShaderProgram(pSVar2,renderCtx,pPVar3);
  this->m_program = pSVar2;
  glu::FragmentSource::~FragmentSource((FragmentSource *)&local_168);
  std::__cxx11::string::~string((string *)&local_188);
  std::__cxx11::string::~string((string *)&local_1a8);
  std::__cxx11::string::~string((string *)&local_1c8);
  glu::VertexSource::~VertexSource((VertexSource *)&local_118);
  std::__cxx11::string::~string((string *)&local_138);
  std::allocator<char>::~allocator(&local_139);
  glu::ProgramSources::~ProgramSources(&local_f0);
  bVar1 = glu::ShaderProgram::isOk(this->m_program);
  if (!bVar1) {
    log = tcu::TestContext::getLog((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx);
    glu::operator<<(log,this->m_program);
    pSVar2 = this->m_program;
    if (pSVar2 != (ShaderProgram *)0x0) {
      glu::ShaderProgram::~ShaderProgram(pSVar2);
      operator_delete(pSVar2,0xd0);
    }
    this->m_program = (ShaderProgram *)0x0;
    this_00 = (TestError *)__cxa_allocate_exception(0x38);
    tcu::TestError::TestError
              (this_00,"Compile failed",(char *)0x0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles2/functional/es2fFlushFinishTests.cpp"
               ,0xca);
    __cxa_throw(this_00,&tcu::TestError::typeinfo,tcu::TestError::~TestError);
  }
  return (int)CONCAT71(extraout_var,bVar1);
}

Assistant:

void FlushFinishCase::init (void)
{
	DE_ASSERT(!m_program);

	m_program = new glu::ShaderProgram(m_context.getRenderContext(),
		glu::ProgramSources()
			<< glu::VertexSource(
				"attribute highp vec4 a_position;\n"
				"varying highp vec4 v_coord;\n"
				"void main (void)\n"
				"{\n"
				"	gl_Position = a_position;\n"
				"	v_coord = a_position;\n"
				"}\n")
			<< glu::FragmentSource(
				"uniform mediump int u_numIters;\n"
				"varying mediump vec4 v_coord;\n"
				"void main (void)\n"
				"{\n"
				"	highp vec4 color = v_coord;\n"
				"	for (int i = 0; i < " + de::toString(int(NUM_ITERS_IN_SHADER)) + "; i++)\n"
				"		color = sin(color);\n"
				"	gl_FragColor = color;\n"
				"}\n"));

	if (!m_program->isOk())
	{
		m_testCtx.getLog() << *m_program;
		delete m_program;
		m_program = DE_NULL;
		TCU_FAIL("Compile failed");
	}
}